

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::GetFilenamePath(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  long lVar2;
  string ret;
  string fn;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  string local_40;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filename->_M_string_length);
  ConvertToUnixSlashes(&local_40);
  lVar2 = std::__cxx11::string::rfind((char *)&local_40,0x575a2d,0xffffffffffffffff);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_40);
    if (local_58 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
    }
    else if ((local_58 == 2) && (local_60._M_p[1] == ':')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_60._M_p,local_60._M_p + 2);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_60._M_p == &local_50) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
      }
      __return_storage_ptr__->_M_string_length = local_58;
      local_58 = 0;
      local_50 = '\0';
      local_60._M_p = &local_50;
    }
    if (local_60._M_p != &local_50) {
      operator_delete(local_60._M_p,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenamePath(const std::string& filename)
{
  std::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  std::string::size_type slash_pos = fn.rfind("/");
  if (slash_pos != std::string::npos) {
    std::string ret = fn.substr(0, slash_pos);
    if (ret.size() == 2 && ret[1] == ':') {
      return ret + '/';
    }
    if (ret.empty()) {
      return "/";
    }
    return ret;
  } else {
    return "";
  }
}